

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

baseHolder * __thiscall
cs_impl::any::holder<std::shared_ptr<cs::context_type>_>::duplicate
          (holder<std::shared_ptr<cs::context_type>_> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  baseHolder *pbVar2;
  
  if ((DAT_0033c900 == 0) || (cs::global_thread_counter != 0)) {
    pbVar2 = (baseHolder *)operator_new(0x18);
  }
  else {
    pbVar2 = *(baseHolder **)(&holder<cs::range_type>::allocator + DAT_0033c900 * 8);
    DAT_0033c900 = DAT_0033c900 + -1;
  }
  pbVar2->_vptr_baseHolder = (_func_int **)&PTR__holder_0032b620;
  pbVar2[1]._vptr_baseHolder =
       (_func_int **)
       (this->mDat).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->mDat).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  pbVar2[2]._vptr_baseHolder = (_func_int **)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return pbVar2;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}